

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetUInt32
          (OptionInterpreter *this,int number,uint32 value,Type type,UnknownFieldSet *unknown_fields
          )

{
  LogMessage *pLVar1;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (type == TYPE_FIXED32) {
    UnknownFieldSet::AddFixed32(unknown_fields,number,value);
    return;
  }
  if (type == TYPE_UINT32) {
    UnknownFieldSet::AddVarint(unknown_fields,number,(ulong)value);
    return;
  }
  internal::LogMessage::LogMessage
            (&local_48,LOGLEVEL_FATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
             ,0x1bb6);
  pLVar1 = internal::LogMessage::operator<<(&local_48,"Invalid wire type for CPPTYPE_UINT32: ");
  pLVar1 = internal::LogMessage::operator<<(pLVar1,type);
  internal::LogFinisher::operator=(&local_49,pLVar1);
  internal::LogMessage::~LogMessage(&local_48);
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetUInt32(
    int number, uint32 value, FieldDescriptor::Type type,
    UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_UINT32:
      unknown_fields->AddVarint(number, static_cast<uint64>(value));
      break;

    case FieldDescriptor::TYPE_FIXED32:
      unknown_fields->AddFixed32(number, static_cast<uint32>(value));
      break;

    default:
      GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_UINT32: " << type;
      break;
  }
}